

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

ssize_t __thiscall
perfetto::base::UnixSocketRaw::Send
          (UnixSocketRaw *this,void *msg,size_t len,int *send_fds,size_t num_fds)

{
  code *pcVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  uint *puVar5;
  char *pcVar6;
  ulong *puVar7;
  uint uVar8;
  msghdr msg_hdr;
  iovec iov;
  char control_buf [256];
  ulong uVar9;
  
  msg_hdr.msg_control = (void *)0x0;
  msg_hdr.msg_controllen = 0;
  msg_hdr.msg_flags = 0;
  msg_hdr._52_4_ = 0;
  msg_hdr.msg_name = (void *)0x0;
  msg_hdr.msg_namelen = 0;
  msg_hdr._12_4_ = 0;
  msg_hdr.msg_iov = &iov;
  msg_hdr.msg_iovlen = 1;
  iov.iov_base = msg;
  iov.iov_len = len;
  if (num_fds != 0) {
    iVar2 = (int)(num_fds << 2);
    uVar8 = iVar2 + 0x17U & 0xfffffff8;
    uVar9 = (ulong)uVar8;
    if (0x100 < uVar8) {
      pcVar4 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar5 = (uint *)__errno_location();
      uVar8 = *puVar5;
      pcVar6 = strerror(uVar8);
      LogMessage(kLogError,pcVar4,0x10837,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(control_buf_len <= sizeof(control_buf))",(ulong)uVar8,pcVar6);
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    memset(control_buf,0,0x100);
    puVar7 = (ulong *)0x0;
    if (0xf < uVar9) {
      puVar7 = (ulong *)control_buf;
    }
    puVar7[1] = 0x100000001;
    *puVar7 = (ulong)(iVar2 + 0x10);
    pcVar4 = (char *)0x10;
    if (0xf < uVar9) {
      pcVar4 = control_buf + 0x10;
    }
    msg_hdr.msg_control = control_buf;
    msg_hdr.msg_controllen = uVar9;
    memcpy(pcVar4,send_fds,num_fds << 2);
  }
  sVar3 = SendMsgAllPosix(this,&msg_hdr);
  return sVar3;
}

Assistant:

ssize_t UnixSocketRaw::Send(const void* msg,
                            size_t len,
                            const int* send_fds,
                            size_t num_fds) {
  PERFETTO_DCHECK(fd_);
  msghdr msg_hdr = {};
  iovec iov = {const_cast<void*>(msg), len};
  msg_hdr.msg_iov = &iov;
  msg_hdr.msg_iovlen = 1;
  alignas(cmsghdr) char control_buf[256];

  if (num_fds > 0) {
    const auto raw_ctl_data_sz = num_fds * sizeof(int);
    const CBufLenType control_buf_len =
        static_cast<CBufLenType>(CMSG_SPACE(raw_ctl_data_sz));
    PERFETTO_CHECK(control_buf_len <= sizeof(control_buf));
    memset(control_buf, 0, sizeof(control_buf));
    msg_hdr.msg_control = control_buf;
    msg_hdr.msg_controllen = control_buf_len;  // used by CMSG_FIRSTHDR
    struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg_hdr);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = static_cast<CBufLenType>(CMSG_LEN(raw_ctl_data_sz));
    memcpy(CMSG_DATA(cmsg), send_fds, num_fds * sizeof(int));
    // note: if we were to send multiple cmsghdr structures, then
    // msg_hdr.msg_controllen would need to be adjusted, see "man 3 cmsg".
  }

  return SendMsgAllPosix(&msg_hdr);
}